

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

PathTypeHandlerBase * __thiscall
Js::SimpleTypeHandler<3UL>::ConvertToPathType(SimpleTypeHandler<3UL> *this,DynamicObject *instance)

{
  Recycler *recycler;
  bool bVar1;
  PropertyTypes values;
  undefined7 extraout_var;
  DynamicType *pDVar2;
  ulong uVar3;
  RecyclableObject *obj;
  PathTypeHandlerBase *pPVar4;
  RecyclerWeakReferenceBase *weakRef;
  uint uVar5;
  PathTypeHandlerBase *pPVar6;
  uint index_00;
  uint uVar7;
  Type *strongReference;
  anon_class_1_1_af1a6535 MarkAsFixed;
  ScriptContext *scriptContext;
  PathTypeSuccessorKey local_90;
  PathTypeSuccessorKey local_88;
  ScriptContext *local_80;
  Type *local_78;
  Phases *local_70;
  Type *local_68;
  DynamicType *local_60;
  DynamicObject *local_58;
  SimpleTypeHandler<3UL> *local_50;
  PropertyIndex local_46;
  uint local_44;
  char cStack_40;
  PropertyIndex index;
  uint local_3c;
  PathTypeHandlerBase *local_38;
  
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  _cStack_40 = 0;
  local_38 = &PathTypeHandlerNoAttr::New
                        (scriptContext,
                         (((scriptContext->super_ScriptContextBase).javascriptLibrary)->rootPath).
                         ptr,0,(PropertyIndex)(this->super_DynamicTypeHandler).slotCapacity,
                         (this->super_DynamicTypeHandler).inlineSlotCapacity,
                         (this->super_DynamicTypeHandler).offsetOfInlineSlots,true,false,
                         (DynamicType *)0x0)->super_PathTypeHandlerBase;
  DynamicTypeHandler::SetFlags(&local_38->super_DynamicTypeHandler,'\b');
  bVar1 = DynamicTypeHandler::ShouldFixAnyProperties();
  if (bVar1) {
    bVar1 = DynamicObject::HasLockedType(instance);
    _cStack_40 = (undefined4)CONCAT71(extraout_var,bVar1);
  }
  strongReference = (instance->super_RecyclableObject).type.ptr;
  index_00 = 0;
  pDVar2 = DynamicType::New(scriptContext,strongReference->typeId,(strongReference->prototype).ptr,
                            (JavascriptMethod)0x0,&local_38->super_DynamicTypeHandler,false,false);
  local_58 = instance;
  if (this->propertyCount < 1) {
    local_3c = 0xffffffff;
    uVar7 = 0;
  }
  else {
    local_78 = this->descriptors;
    local_70 = (Phases *)&DAT_015a4e90;
    uVar5 = 0;
    pPVar6 = local_38;
    local_80 = scriptContext;
    local_68 = strongReference;
    local_60 = pDVar2;
    local_50 = this;
    do {
      uVar3 = (ulong)((uVar5 & 0xffff) << 4);
      local_3c = *(uint *)(*(long *)((long)&(local_78->Id).ptr + uVar3) + 8);
      local_44 = *(byte *)((long)&local_78->field_1 + uVar3) & 0xf;
      PathTypeSuccessorKey::PathTypeSuccessorKey(&local_90,local_3c,(ObjectSlotAttributes)local_44);
      MarkAsFixed.markAsFixed = false;
      local_60 = PathTypeHandlerBase::PromoteType<false>
                           (pPVar6,local_60,local_90,false,scriptContext,instance,&local_46);
      local_38 = PathTypeHandlerBase::FromTypeHandler((local_60->typeHandler).ptr);
      obj = (RecyclableObject *)DynamicObject::GetSlot(instance,index_00);
      if ((((cStack_40 != '\0') && (MarkAsFixed.markAsFixed = false, (ulong)obj >> 0x30 == 0)) &&
          (0xf < local_3c)) && (obj != (RecyclableObject *)0x0)) {
        bVar1 = VarIsImpl<Js::JavascriptFunction>(obj);
        if (bVar1) {
          bVar1 = Phases::IsEnabled(local_70,FixMethodPropsPhase);
          MarkAsFixed.markAsFixed = !bVar1;
        }
        else {
          MarkAsFixed.markAsFixed = false;
        }
      }
      pPVar6 = local_38;
      instance = local_58;
      scriptContext = local_80;
      PathTypeHandlerBase::
      InitializePath<Js::SimpleTypeHandler<3ul>::ConvertToPathType(Js::DynamicObject*)::_lambda()_1_>
                (local_38,local_58,(PropertyIndex)uVar5,
                 (local_38->super_DynamicTypeHandler).unusedBytes >> 1,local_80,MarkAsFixed);
      uVar5 = (uVar5 & 0xffff) + 1;
      index_00 = uVar5 & 0xffff;
      strongReference = local_68;
      this = local_50;
      uVar7 = local_44;
    } while ((int)index_00 < local_50->propertyCount);
  }
  if (*(char *)&strongReference[1].javascriptLibrary.ptr != '\0') {
    DynamicTypeHandler::LockTypeHandler(&local_38->super_DynamicTypeHandler);
  }
  if (*(char *)((long)&strongReference[1].javascriptLibrary.ptr + 1) == '\x01') {
    DynamicTypeHandler::ShareTypeHandler(&local_38->super_DynamicTypeHandler,scriptContext);
  }
  pPVar6 = local_38;
  DynamicTypeHandler::SetFlags
            (&local_38->super_DynamicTypeHandler,(this->super_DynamicTypeHandler).flags & 0x22);
  values = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes(&pPVar6->super_DynamicTypeHandler,0xb0,values);
  DynamicTypeHandler::SetInstanceTypeHandler(&pPVar6->super_DynamicTypeHandler,local_58,false);
  pDVar2 = (pPVar6->predecessorType).ptr;
  if (pDVar2 != (DynamicType *)0x0) {
    pPVar4 = PathTypeHandlerBase::FromTypeHandler((pDVar2->typeHandler).ptr);
    pDVar2 = (pPVar6->predecessorType).ptr;
    PathTypeSuccessorKey::PathTypeSuccessorKey(&local_88,local_3c,(ObjectSlotAttributes)uVar7);
    recycler = scriptContext->recycler;
    weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                        (&recycler->weakReferenceMap,(char *)strongReference,recycler);
    if (weakRef->typeInfo == (Type)0x0) {
      weakRef->typeInfo = (Type)&DynamicType::typeinfo;
      Memory::Recycler::TrackAllocWeakRef(recycler,weakRef);
    }
    PathTypeSuccessorInfo::ReplaceSuccessor
              ((pPVar4->successorInfo).ptr,pDVar2,local_88,
               (RecyclerWeakReference<Js::DynamicType> *)weakRef);
    pPVar6 = local_38;
  }
  return pPVar6;
}

Assistant:

PathTypeHandlerBase* SimpleTypeHandler<size>::ConvertToPathType(DynamicObject* instance)
    {
        ScriptContext *scriptContext = instance->GetScriptContext();
        PathTypeHandlerBase* newTypeHandler =
            PathTypeHandlerNoAttr::New(
                scriptContext,
                scriptContext->GetLibrary()->GetRootPath(),
                0,
                static_cast<PropertyIndex>(this->GetSlotCapacity()),
                this->GetInlineSlotCapacity(),
                this->GetOffsetOfInlineSlots(),
                true,
                false);
        newTypeHandler->SetMayBecomeShared();

#if ENABLE_FIXED_FIELDS
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        Assert(HasSingletonInstanceOnlyIfNeeded());

        // If instance has a shared type, the type handler change below will induce a type transition, which
        // guarantees that any existing fast path field stores (which could quietly overwrite a fixed field
        // on this instance) will be invalidated.  It is safe to mark all fields as fixed.
        bool const allowFixedFields = DynamicTypeHandler::AreSingletonInstancesNeeded() && instance->HasLockedType();
#endif
#endif

        DynamicType *existingType = instance->GetDynamicType();
        DynamicType *currentType = DynamicType::New(scriptContext, existingType->GetTypeId(), existingType->GetPrototype(), nullptr, newTypeHandler, false, false);
        PropertyId propertyId = Constants::NoProperty;
        ObjectSlotAttributes attr = ObjectSlotAttr_None;
        for (PropertyIndex i = 0; i < propertyCount; i++)
        {
            propertyId = descriptors[i].Id->GetPropertyId();
            attr = PathTypeHandlerBase::PropertyAttributesToObjectSlotAttributes(descriptors[i].Attributes);
            PropertyIndex index;
            currentType = newTypeHandler->PromoteType<false>(currentType, PathTypeSuccessorKey(propertyId, attr), false, scriptContext, instance, &index);
            newTypeHandler = PathTypeHandlerBase::FromTypeHandler(currentType->GetTypeHandler());
#if ENABLE_FIXED_FIELDS
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
            Var value = instance->GetSlot(i);
            bool markAsFixed = allowFixedFields && !IsInternalPropertyId(propertyId) && value != nullptr &&
                (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : false);
            newTypeHandler->InitializePath(instance, i, newTypeHandler->GetPathLength(), scriptContext, [=]() { return markAsFixed; });
#endif
#endif
        }

        if (existingType->GetIsLocked())
        {
            newTypeHandler->LockTypeHandler();
        }
        if (existingType->GetIsShared())
        {
            newTypeHandler->ShareTypeHandler(scriptContext);
        }
        newTypeHandler->SetFlags(IsPrototypeFlag | HasKnownSlot0Flag, this->GetFlags());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance, false);
        if (newTypeHandler->GetPredecessorType())
        {
            PathTypeHandlerBase *predTypeHandler = PathTypeHandlerBase::FromTypeHandler(newTypeHandler->GetPredecessorType()->GetTypeHandler());
            predTypeHandler->ReplaceSuccessor(newTypeHandler->GetPredecessorType(), PathTypeSuccessorKey(propertyId, attr), scriptContext->GetRecycler()->CreateWeakReferenceHandle<DynamicType>(existingType));
        }

        return newTypeHandler;
    }